

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumn *pIVar5;
  char *pcVar6;
  char local_51;
  int local_3c;
  int local_38;
  int n;
  int column_n;
  int order_n;
  int dst_order;
  int src_order;
  ImGuiTableColumn *dst_column;
  ImGuiTableColumn *src_column;
  int reorder_dir;
  ImGuiTable *table_local;
  
  if (table->InstanceCurrent == 0) {
    if ((table->ResizedColumn != -1) &&
       ((table->ResizedColumnNextWidth != 3.4028235e+38 || (NAN(table->ResizedColumnNextWidth))))) {
      TableSetColumnWidth((int)table->ResizedColumn,table->ResizedColumnNextWidth);
    }
    table->LastResizedColumn = table->ResizedColumn;
    table->ResizedColumnNextWidth = 3.4028235e+38;
    table->ResizedColumn = -1;
    if (table->AutoFitSingleColumn != -1) {
      cVar1 = table->AutoFitSingleColumn;
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)table->AutoFitSingleColumn)
      ;
      TableSetColumnWidth((int)cVar1,pIVar4->WidthAuto);
      table->AutoFitSingleColumn = -1;
    }
  }
  if (table->InstanceCurrent == 0) {
    if ((table->HeldHeaderColumn == -1) && (table->ReorderColumn != -1)) {
      table->ReorderColumn = -1;
    }
    table->HeldHeaderColumn = -1;
    if ((table->ReorderColumn != -1) && (table->ReorderColumnDir != '\0')) {
      cVar1 = table->ReorderColumnDir;
      iVar3 = (int)cVar1;
      if (iVar3 != -1 && iVar3 != 1) {
        __assert_fail("reorder_dir == -1 || reorder_dir == +1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                      ,0x271,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      if ((table->Flags & 2U) == 0) {
        __assert_fail("table->Flags & ImGuiTableFlags_Reorderable",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                      ,0x272,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)table->ReorderColumn);
      if (iVar3 == -1) {
        local_51 = pIVar4->PrevEnabledColumn;
      }
      else {
        local_51 = pIVar4->NextEnabledColumn;
      }
      pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)local_51);
      n = (int)pIVar4->DisplayOrder;
      cVar2 = pIVar5->DisplayOrder;
      pIVar4->DisplayOrder = cVar2;
      while (n = n + iVar3, n != cVar2 + iVar3) {
        pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,n);
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar6);
        pIVar4->DisplayOrder = pIVar4->DisplayOrder - cVar1;
      }
      if ((int)pIVar5->DisplayOrder != cVar2 - iVar3) {
        __assert_fail("dst_column->DisplayOrder == dst_order - reorder_dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                      ,0x27b,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      for (local_38 = 0; local_38 < table->ColumnsCount; local_38 = local_38 + 1) {
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_38);
        pcVar6 = ImSpan<signed_char>::operator[]
                           (&table->DisplayOrderToIndex,(int)pIVar4->DisplayOrder);
        *pcVar6 = (char)local_38;
      }
      table->ReorderColumnDir = '\0';
      table->IsSettingsDirty = true;
    }
  }
  if ((table->IsResetDisplayOrderRequest & 1U) != 0) {
    for (local_3c = 0; local_3c < table->ColumnsCount; local_3c = local_3c + 1) {
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_3c);
      pIVar4->DisplayOrder = (ImGuiTableColumnIdx)local_3c;
      pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,local_3c);
      *pcVar6 = (ImGuiTableColumnIdx)local_3c;
    }
    table->IsResetDisplayOrderRequest = false;
    table->IsSettingsDirty = true;
  }
  return;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}